

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refmap.c
# Opt level: O0

flatcc_refmap_ref_t flatcc_refmap_insert(flatcc_refmap_t *refmap,void *src,flatcc_refmap_ref_t ref)

{
  flatcc_refmap_item *pfVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t k;
  size_t j;
  size_t i;
  size_t N;
  flatcc_refmap_item *T;
  flatcc_refmap_ref_t ref_local;
  void *src_local;
  flatcc_refmap_t *refmap_local;
  
  refmap_local._4_4_ = ref;
  if (src != (void *)0x0) {
    sVar3 = _flatcc_refmap_above_load_factor(refmap->count,refmap->buckets);
    if ((sVar3 == 0) || (iVar2 = flatcc_refmap_resize(refmap,refmap->count << 1), iVar2 == 0)) {
      pfVar1 = refmap->table;
      sVar3 = refmap->buckets;
      sVar4 = _flatcc_refmap_hash(src);
      j = 0;
      sVar5 = sVar4;
      while (k = sVar5 & sVar3 - 1, pfVar1[k].src != (void *)0x0) {
        if (pfVar1[k].src == src) {
          pfVar1[k].ref = ref;
          return ref;
        }
        j = j + 1;
        sVar5 = sVar4 + j;
      }
      refmap->count = refmap->count + 1;
      pfVar1[k].src = src;
      pfVar1[k].ref = ref;
    }
    else {
      refmap_local._4_4_ = 0;
    }
  }
  return refmap_local._4_4_;
}

Assistant:

flatcc_refmap_ref_t flatcc_refmap_insert(flatcc_refmap_t *refmap, const void *src, flatcc_refmap_ref_t ref)
{
    struct flatcc_refmap_item *T;
    size_t N, i, j, k;

    if (src == 0) return ref;
    if (_flatcc_refmap_above_load_factor(refmap->count, refmap->buckets)) {
        if (flatcc_refmap_resize(refmap, refmap->count * 2)) {
            return flatcc_refmap_not_found; /* alloc failed */
        }
    }
    T = refmap->table;
    N = refmap->buckets - 1;
    k = _flatcc_refmap_hash(src);
    i = 0;
    j = _flatcc_refmap_probe(k, i, N);
    while (T[j].src) {
        if (T[j].src == src) {
            return T[j].ref = ref;
        }
        ++i;
        j = _flatcc_refmap_probe(k, i, N);
    }
    ++refmap->count;
    T[j].src = src;
    return T[j].ref = ref;
}